

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

ExecutionResult __thiscall nigel::Lexer::onExecute(Lexer *this,CodeBase *base)

{
  size_t *psVar1;
  long *plVar2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  _List_node_base *p_Var6;
  pointer pLVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined7 uVar10;
  ulong uVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  Lexer *this_01;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  byte c;
  bool bVar15;
  String tmpStr;
  undefined1 local_109;
  Token_Comment *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  undefined1 local_f8 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  ulong local_c8;
  int local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_98;
  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> local_90 [8];
  Lexer *local_88;
  Token_Comment *local_80;
  Lexer *pLStack_78;
  Token_Comment *local_70;
  Lexer *pLStack_68;
  Token_Comment *local_60;
  Lexer *pLStack_58;
  undefined1 local_50 [32];
  
  local_f8._0_8_ = local_f8 + 0x10;
  local_f8._8_8_ = (_List_node_base *)0x0;
  local_f8[0x10] = '\0';
  this->currLineNo = 1;
  this->currColumnNo = 0;
  pLVar7 = (base->fileCont).
           super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if (pLVar7 != (base->fileCont).
                super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->currLine).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (pLVar7->content).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->currLine).
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(pLVar7->content).
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    pLVar7 = (base->fileCont).
             super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->currPath).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (pLVar7->path).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    this_00._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         &(this->currPath).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00._M_pi,
               &(pLVar7->path).
                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&base->lexerStruct;
  local_98 = &(this->currLine).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
  local_a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       &(this->currPath).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  local_c0 = 0;
  local_b4 = 0;
  bVar3 = false;
  local_bc = 0;
  local_a8 = (element_type *)0x0;
  uVar13 = 0;
  uVar11 = 0;
  do {
    pLVar7 = (base->fileCont).
             super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar15 = uVar11 < (ulong)(((long)(base->fileCont).
                                     super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar7 >> 3)
                             * -0x3333333333333333);
    local_c8 = uVar13;
    if (bVar15) {
      if (*(ulong *)((long)pLVar7[uVar11].content.
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 8) <= this->currColumnNo) {
        lVar14 = uVar11 * 0x28;
        do {
          if (bVar3) {
            local_108 = (Token_Comment *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<nigel::Token_Comment,std::allocator<nigel::Token_Comment>,std::__cxx11::string&>
                      (&_Stack_100,&local_108,(allocator<nigel::Token_Comment> *)&local_109,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
            std::__shared_ptr<nigel::Token_Comment,(__gnu_cxx::_Lock_policy)2>::
            _M_enable_shared_from_this_with<nigel::Token_Comment,nigel::Token_Comment>
                      ((__shared_ptr<nigel::Token_Comment,(__gnu_cxx::_Lock_policy)2> *)&local_108,
                       local_108);
            local_60 = local_108;
            pLStack_58 = (Lexer *)_Stack_100._M_pi;
            local_108 = (Token_Comment *)0x0;
            _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            makeToken((Lexer *)(local_f8 + 0x20),(shared_ptr<nigel::Token> *)this);
            p_Var6 = (_List_node_base *)operator_new(0x20);
            p_Var4 = local_d0;
            p_Var6[1]._M_next = (_List_node_base *)local_f8._32_8_;
            p_Var6[1]._M_prev = (_List_node_base *)0x0;
            local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var6[1]._M_prev = (_List_node_base *)p_Var4;
            local_f8._32_8_ = (_List_node_base *)0x0;
            std::__detail::_List_node_base::_M_hook(p_Var6);
            psVar1 = &(base->lexerStruct).
                      super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            if (pLStack_58 != (Lexer *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_58);
            }
            this_00._M_pi = _Stack_100._M_pi;
            if ((Lexer *)_Stack_100._M_pi != (Lexer *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_100._M_pi);
            }
            local_f8._8_8_ = (_List_node_base *)0x0;
            *(char *)local_f8._0_8_ = '\0';
            bVar3 = false;
          }
          this->currColumnNo = 0;
          uVar11 = uVar11 + 1;
          pLVar7 = (base->fileCont).
                   super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (uVar11 < (ulong)(((long)(base->fileCont).
                                      super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar7 >> 3
                               ) * -0x3333333333333333)) {
            this->currLineNo = *(size_t *)((long)&pLVar7[1].line + lVar14);
            (this->currLine).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = *(element_type **)
                       ((long)&pLVar7[1].content.
                               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar14);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (local_98,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                ((long)&pLVar7[1].content.
                                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount + lVar14));
            pLVar7 = (base->fileCont).
                     super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            (this->currPath).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = *(element_type **)
                       ((long)&pLVar7[1].path.
                               super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar14);
            this_00._M_pi = local_a0._M_pi;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_pi,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&pLVar7[1].path.
                               super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount + lVar14));
          }
          pLVar7 = (base->fileCont).
                   super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar15 = uVar11 < (ulong)(((long)(base->fileCont).
                                           super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar7
                                    >> 3) * -0x3333333333333333);
          if (!bVar15) goto LAB_00166d2c;
          plVar2 = (long *)((long)&pLVar7[1].content.
                                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar14);
          lVar14 = lVar14 + 0x28;
        } while (*(ulong *)(*plVar2 + 8) <= this->currColumnNo);
      }
      if (!bVar15) goto LAB_00166d2c;
      plVar2 = (long *)pLVar7[uVar11].content.
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
      uVar13 = this->currColumnNo;
      this->currColumnNo = uVar13 + 1;
      if ((ulong)plVar2[1] <= uVar13) {
        uVar9 = std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
        if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
        }
        if (pLStack_78 != (Lexer *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_78);
        }
        if ((Lexer *)_Stack_100._M_pi != (Lexer *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_100._M_pi);
        }
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
        }
        _Unwind_Resume(uVar9);
      }
      uVar13 = (ulong)*(byte *)(*plVar2 + uVar13);
    }
    else {
LAB_00166d2c:
      uVar13 = 0;
      local_a8 = (element_type *)CONCAT71((int7)((ulong)pLVar7 >> 8),1);
    }
    c = (byte)uVar13;
    uVar12 = (uint)uVar13;
    if (((local_bc & 1) == 0) || ((char)local_c8 != '\\' && c == 0x22)) {
      if (bVar3) goto LAB_00166da9;
      if ((local_b4 & 1) == 0) {
        if ((0x20 < c) || ((0x100002601U >> (uVar13 & 0x3f) & 1) == 0)) {
          local_b8 = (uint)(char)c;
          bVar15 = isOperator((Lexer *)this_00._M_pi,c);
          if (bVar15) {
            if (c == 0x2a) {
LAB_00166fca:
              this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8;
              iVar5 = std::__cxx11::string::compare((char *)this_00._M_pi);
              if (iVar5 == 0) {
                local_c0 = local_c0 + 1;
                local_f8._8_8_ = (_List_node_base *)0x0;
                *(char *)local_f8._0_8_ = '\0';
                local_b4 = (uint)CONCAT71(SUB87(local_f8._0_8_,1),1);
                goto switchD_00166f84_caseD_6f;
              }
            }
            else if (uVar12 == 0x2f) {
              this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8;
              iVar5 = std::__cxx11::string::compare((char *)this_00._M_pi);
              if (iVar5 == 0) {
                local_f8._8_8_ = (_List_node_base *)0x0;
                *(char *)local_f8._0_8_ = '\0';
                bVar3 = true;
                goto switchD_00166f84_caseD_6f;
              }
              if (c == 0x2a) goto LAB_00166fca;
            }
            bVar15 = isOperator((Lexer *)this_00._M_pi,(char)local_c8);
            if (bVar15) goto LAB_00166da9;
LAB_00166ff5:
            if ((_List_node_base *)local_f8._8_8_ == (_List_node_base *)0x0) goto LAB_00166da9;
          }
          else {
            uVar9 = extraout_RDX;
            if (9 < (byte)(c - 0x30)) {
              if (c == 0x78) {
                this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8;
                iVar5 = std::__cxx11::string::compare((char *)this_00._M_pi);
                uVar9 = extraout_RDX_01;
                if (iVar5 == 0) goto LAB_00167026;
              }
              if ((((5 < (byte)((c & 0xdf) + 0xbf)) ||
                   ((ulong)local_f8._8_8_ < (_List_node_base *)0x2)) ||
                  (*(char *)local_f8._0_8_ != '0')) || (*(char *)(local_f8._0_8_ + 1) != 'x')) {
                bVar15 = isDividingToken((Lexer *)this_00._M_pi,(char)local_b8);
                if (bVar15) {
                  bVar15 = isDividingToken((Lexer *)this_00._M_pi,(char)local_c8);
                  if (!bVar15) {
                    if (c == 0x22) {
                      if ((local_bc & 1) == 0) {
                        local_bc = local_bc & 0xff;
                        if ((_List_node_base *)local_f8._8_8_ == (_List_node_base *)0x0) {
                          local_bc = 1;
                        }
                      }
                      else {
                        local_108 = (Token_Comment *)0x0;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<nigel::Token_StringL,std::allocator<nigel::Token_StringL>,std::__cxx11::string&>
                                  (&_Stack_100,(Token_StringL **)&local_108,
                                   (allocator<nigel::Token_StringL> *)&local_109,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_f8);
                        std::__shared_ptr<nigel::Token_StringL,(__gnu_cxx::_Lock_policy)2>::
                        _M_enable_shared_from_this_with<nigel::Token_StringL,nigel::Token_StringL>
                                  ((__shared_ptr<nigel::Token_StringL,(__gnu_cxx::_Lock_policy)2> *)
                                   &local_108,(Token_StringL *)local_108);
                        local_80 = local_108;
                        pLStack_78 = (Lexer *)_Stack_100._M_pi;
                        local_108 = (Token_Comment *)0x0;
                        _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        makeToken((Lexer *)(local_f8 + 0x20),(shared_ptr<nigel::Token> *)this);
                        p_Var6 = (_List_node_base *)operator_new(0x20);
                        p_Var4 = local_d0;
                        p_Var6[1]._M_next = (_List_node_base *)local_f8._32_8_;
                        p_Var6[1]._M_prev = (_List_node_base *)0x0;
                        local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        p_Var6[1]._M_prev = (_List_node_base *)p_Var4;
                        local_f8._32_8_ = (_List_node_base *)0x0;
                        std::__detail::_List_node_base::_M_hook(p_Var6);
                        psVar1 = &(base->lexerStruct).
                                  super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                                  ._M_impl._M_node._M_size;
                        *psVar1 = *psVar1 + 1;
                        if (pLStack_78 != (Lexer *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_78);
                        }
                        this_00._M_pi = _Stack_100._M_pi;
                        if ((Lexer *)_Stack_100._M_pi != (Lexer *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (_Stack_100._M_pi);
                        }
                        local_f8._8_8_ = (_List_node_base *)0x0;
                        *(char *)local_f8._0_8_ = '\0';
                        local_bc = 0;
                      }
                      goto switchD_00166f84_caseD_6f;
                    }
                    goto LAB_00166ff5;
                  }
                }
                if (((char)local_c8 != '\0') &&
                   (bVar15 = isIdentifier((Lexer *)this_00._M_pi,(char)local_c8), !bVar15))
                goto LAB_00167316;
                goto LAB_00166da9;
              }
            }
LAB_00167026:
            bVar15 = false;
            uVar8 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
            if (((_List_node_base *)local_f8._8_8_ != (_List_node_base *)0x0) &&
               (9 < (byte)((char)local_c8 - 0x30U))) {
              bVar15 = isIdentifier((Lexer *)this_00._M_pi,*(char *)local_f8._0_8_);
              if (bVar15) {
                bVar15 = false;
                uVar9 = extraout_RDX_00;
              }
              else {
                std::__cxx11::string::substr((ulong)local_50,(ulong)local_f8);
                this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50;
                iVar5 = std::__cxx11::string::compare((char *)this_00._M_pi);
                bVar15 = true;
                uVar9 = extraout_RDX_02;
                if (iVar5 != 0) {
                  this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8;
                  iVar5 = std::__cxx11::string::compare((char *)this_00._M_pi);
                  uVar9 = extraout_RDX_03;
                  if (iVar5 == 0) {
LAB_001672a8:
                    uVar10 = (undefined7)((ulong)uVar9 >> 8);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (((_List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                           *)&(local_b0._M_pi)->_vptr__Sp_counted_base)->_M_impl)._M_node.
                        super__List_node_base._M_next == local_b0._M_pi) {
                      uVar8 = CONCAT71(uVar10,1);
                    }
                    else {
                      iVar5 = *(int *)&(base->lexerStruct).
                                       super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                                       ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next[1].
                                       _M_prev;
                      uVar8 = CONCAT71(uVar10,iVar5 == 0x3b || iVar5 == 0x18);
                    }
                  }
                  else {
                    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8;
                    iVar5 = std::__cxx11::string::compare((char *)this_00._M_pi);
                    uVar9 = extraout_RDX_04;
                    if (iVar5 == 0) goto LAB_001672a8;
                    uVar8 = 0;
                  }
                  bVar15 = true;
                  goto LAB_001672d1;
                }
              }
              uVar8 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
            }
LAB_001672d1:
            if ((bVar15) &&
               (this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._0_8_,
               (Lexer *)local_50._0_8_ != (Lexer *)(local_50 + 0x10))) {
              local_b8 = (uint)uVar8;
              operator_delete((void *)local_50._0_8_,
                              (ulong)((long)(_List_node_base **)local_50._16_8_ + 1));
              uVar8 = (ulong)local_b8;
            }
            if ((char)uVar8 != '\0') goto LAB_00166da9;
            if ((_List_node_base *)local_f8._8_8_ == (_List_node_base *)0x0)
            goto switchD_00166f84_caseD_6f;
          }
LAB_00167316:
          adoptToken(this,(String *)local_f8,base);
          goto LAB_00166da9;
        }
        if ((_List_node_base *)local_f8._8_8_ != (_List_node_base *)0x0) {
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
          adoptToken(this,(String *)local_f8,base);
        }
        this->previousColumnNo = this->previousColumnNo + 1;
      }
      else {
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8;
        std::__cxx11::string::push_back((char)this_00._M_pi);
        iVar5 = local_c0;
        if ((c == 0x2f && (char)local_c8 == '*') && (iVar5 = local_c0 + -1, local_c0 + -1 == 0)) {
          std::__cxx11::string::pop_back();
          std::__cxx11::string::pop_back();
          local_108 = (Token_Comment *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<nigel::Token_Comment,std::allocator<nigel::Token_Comment>,std::__cxx11::string&>
                    (&_Stack_100,&local_108,(allocator<nigel::Token_Comment> *)&local_109,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
          std::__shared_ptr<nigel::Token_Comment,(__gnu_cxx::_Lock_policy)2>::
          _M_enable_shared_from_this_with<nigel::Token_Comment,nigel::Token_Comment>
                    ((__shared_ptr<nigel::Token_Comment,(__gnu_cxx::_Lock_policy)2> *)&local_108,
                     local_108);
          local_70 = local_108;
          pLStack_68 = (Lexer *)_Stack_100._M_pi;
          local_108 = (Token_Comment *)0x0;
          _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          makeToken((Lexer *)(local_f8 + 0x20),(shared_ptr<nigel::Token> *)this);
          p_Var6 = (_List_node_base *)operator_new(0x20);
          p_Var4 = local_d0;
          p_Var6[1]._M_next = (_List_node_base *)local_f8._32_8_;
          p_Var6[1]._M_prev = (_List_node_base *)0x0;
          local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var6[1]._M_prev = (_List_node_base *)p_Var4;
          local_f8._32_8_ = (_List_node_base *)0x0;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &(base->lexerStruct).
                    super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if (pLStack_68 != (Lexer *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_68);
          }
          this_00._M_pi = _Stack_100._M_pi;
          if ((Lexer *)_Stack_100._M_pi != (Lexer *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_100._M_pi);
          }
          local_f8._8_8_ = (_List_node_base *)0x0;
          *(char *)local_f8._0_8_ = '\0';
          local_b4 = 0;
          iVar5 = 0;
        }
        local_c0 = iVar5 + (uint)(c == 0x2a && (char)local_c8 == '/');
      }
      goto switchD_00166f84_caseD_6f;
    }
    if ((char)local_c8 != '\\') {
      if (c != 0x5c) goto LAB_00166da9;
      goto switchD_00166f84_caseD_6f;
    }
    if (uVar12 < 0x62) {
      uVar8 = (ulong)(uVar12 - 0x22);
      if ((uVar12 - 0x22 < 0x40) &&
         ((((0x400000020000021U >> (uVar8 & 0x3f) & 1) != 0 || (uVar8 == 0xe)) || (uVar8 == 0x3f))))
      goto LAB_00166da9;
      goto switchD_00166f84_caseD_6f;
    }
    switch(uVar12) {
    case 0x6e:
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
      goto switchD_00166f84_caseD_6f;
    case 0x72:
      break;
    case 0x74:
      break;
    case 0x76:
      break;
    default:
      if ((uVar12 == 0x62) || (uVar12 == 0x66)) break;
      goto switchD_00166f84_caseD_6f;
    }
LAB_00166da9:
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8;
    std::__cxx11::string::push_back((char)this_00._M_pi);
switchD_00166f84_caseD_6f:
    if ((char)local_c8 == '\\') {
      uVar13 = 0;
    }
    if (((ulong)local_a8 & 1) != 0) {
      local_108 = (Token_Comment *)CONCAT44(local_108._4_4_,1);
      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                (local_90,(allocator<nigel::Token> *)&local_109,(Type *)&local_108);
      makeToken((Lexer *)(local_f8 + 0x20),(shared_ptr<nigel::Token> *)this);
      p_Var6 = (_List_node_base *)operator_new(0x20);
      p_Var4 = local_d0;
      p_Var6[1]._M_next = (_List_node_base *)local_f8._32_8_;
      p_Var6[1]._M_prev = (_List_node_base *)0x0;
      local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var6[1]._M_prev = (_List_node_base *)p_Var4;
      local_f8._32_8_ = 0;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar1 = &(base->lexerStruct).
                super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      this_01 = local_88;
      if (local_88 != (Lexer *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88);
        this_01 = local_88;
      }
      postLexer(this_01,base);
      if (base->printLexer == true) {
        printLexerStructure(this_01,base);
      }
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
      }
      return success;
    }
  } while( true );
}

Assistant:

ExecutionResult Lexer::onExecute( CodeBase &base )
	{
		size_t fileLine = 0;
		//size_t fileColumn = 0;

		u8 c, previousC = 0;
		String tmpStr;
		bool finish = false;
		currLineNo = 1;
		currColumnNo = 0;

		//Special values
		bool isString = false;//If is string literal
		bool isLineComment = false;//If is comment from // untile lineend
		bool isMultiComment = false;//If is multiline-comment with /* */
		int multiCommentCount = 0;//Enables nested comments
		if( !base.fileCont.empty() )
		{
			currLine = base.fileCont[0].content;
			currPath = base.fileCont[0].path;
		}

		while( !finish )
		{//Iterate whole file content
			while( fileLine < base.fileCont.size() && currColumnNo >= base.fileCont[fileLine].content->size() )
			{//Newline
				if( isLineComment )
				{
					base.lexerStruct.push_back( makeToken( std::make_shared<Token_Comment>( tmpStr ) ) );
					tmpStr.clear();
					isLineComment = false;
				}
				currColumnNo = 0;
				fileLine++;
				if( fileLine < base.fileCont.size() )
				{
					currLineNo = base.fileCont[fileLine].line;
					currLine = base.fileCont[fileLine].content;
					currPath = base.fileCont[fileLine].path;
				}
			}
			if( fileLine >= base.fileCont.size() )
			{
				finish = true;
				c = 0;
			}
			else c = base.fileCont[fileLine].content->at( currColumnNo++ );


			if( isString && ( c != '"' || previousC == '\\'  ) )
			{//Capture string literal
				if( previousC == '\\' )
				{
					if( c == '\\' ) tmpStr += '\\';//Backslash
					else if( c == 'n' ) tmpStr += '\n';//Newline
					else if( c == 'r' ) tmpStr += '\r';//Carriage return
					else if( c == 't' ) tmpStr += '\t';//Tabulator
					else if( c == 'v' ) tmpStr += '\v';//Vertical tabulator
					else if( c == 'b' ) tmpStr += '\b';//Backspace
					else if( c == 'f' ) tmpStr += '\f';//Form feed
					else if( c == 'a' ) tmpStr += '\a';//Alert
					else if( c == '?' ) tmpStr += '\?';//Question mark
					else if( c == '\'' ) tmpStr += '\'';//Single quote
					else if( c == '"' ) tmpStr += '\"';//Double quote
					else if( c == '0' ) tmpStr += '\0';//Null as value, not as character.
				}
				else if( c != '\\' ) tmpStr += c;
			}
			else if( isLineComment )
			{//Capture comment
				tmpStr += c;
			}
			else if( isMultiComment )
			{//Capture comment
				tmpStr += c;
				if( previousC == '*' && c == '/' )
				{//Comment finished
					multiCommentCount--;
					if( multiCommentCount == 0 )
					{
						tmpStr.pop_back();//Remove *
						tmpStr.pop_back();//Remove /

						base.lexerStruct.push_back( makeToken( std::make_shared<Token_Comment>( tmpStr ) ) );
						tmpStr.clear();
						isMultiComment = false;
					}
				}
				if( previousC == '/' && c == '*' ) multiCommentCount++;
			}


			else if( isWhitespace( c ) )
			{//Ignore and split token
				if( !tmpStr.empty() )
				{//Finish previous token
					adoptToken( tmpStr, base );
				}
				previousColumnNo++;
			}
			else if( isOperator( c ) )
			{
				if( c == '/' && tmpStr == "/" )
				{//Found comment with //
					isLineComment = true;
					tmpStr.clear();
				}
				else if( c == '*' && tmpStr == "/" )
				{//Found comment with /*
					isMultiComment = true;
					multiCommentCount++;
					tmpStr.clear();
				}

				else if( isOperator( previousC ) || tmpStr.empty() ) tmpStr += c;
				else if( !tmpStr.empty() )
				{//Finish previous token
					adoptToken( tmpStr, base );
					tmpStr += c;
				}
			}
			else if (isNumber(c) || (c == 'x' && tmpStr == "0") || ( isHexValue(c) && tmpStr.size() >=2 && tmpStr[0] == '0' && tmpStr[1] == 'x'))
			{
				if( tmpStr.empty() || isNumber( previousC ) || isIdentifier( tmpStr.front() ) || previousC == '0' || tmpStr.substr(0, 2) == "0x" ||
					( ( tmpStr == "-" || tmpStr == "+" ) && ( base.lexerStruct.empty() || base.lexerStruct.back()->type == Token::Type::operatorToken || base.lexerStruct.back()->type == Token::Type::dividingToken ) )
					) tmpStr += c;
				else if( !tmpStr.empty() )
				{//Finish previous token
					adoptToken( tmpStr, base );
					tmpStr += c;
				}
			}
			else if( isDividingToken( c ) && !isDividingToken( previousC ) )
			{
				if( c == '"' )
				{
					if( isString )
					{//Admit string
						base.lexerStruct.push_back( makeToken( std::make_shared<Token_StringL>( tmpStr ) ) );
						tmpStr.clear();
						isString = false;
					}
					else if( tmpStr.empty() ) isString = true;
				}
				else
				{
					if( isDividingToken( previousC ) || tmpStr.empty() ) tmpStr += c;
					else if( !tmpStr.empty() )
					{//Finish previous token
						adoptToken( tmpStr, base );
						tmpStr += c;
					}
				}
			}
			else
			{
				if( previousC == 0 || isIdentifier( previousC ) )
					tmpStr += c;
				else
				{//Finish previous token
					adoptToken( tmpStr, base );
					tmpStr += c;
				}
			}

			if( previousC != '\\' ) previousC = c;
			else previousC = 0;
		}
		base.lexerStruct.push_back( makeToken( std::make_shared<Token>( Token::Type::eof ) ) );

		postLexer( base );

		if( base.printLexer ) printLexerStructure( base );

		return ExecutionResult::success;
	}